

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

data_node_type * __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
bulk_load_leaf_node_from_existing
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *existing_node,int left,int right,bool compute_cost,
          FTNode *tree_node,bool reuse_model,bool keep_left,bool keep_right)

{
  byte bVar1;
  int iVar2;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *pAVar3;
  byte bVar4;
  int in_ECX;
  byte bVar5;
  int in_EDX;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_RSI;
  long in_RDI;
  byte in_R8B;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_R9;
  double dVar6;
  byte in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  LinearModel<double> precomputed_model_1;
  int num_actual_keys;
  LinearModel<double> precomputed_model;
  self_type *in_stack_00000068;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_00000070;
  data_node_type *node;
  int in_stack_00000088;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  AlexCompare *in_stack_ffffffffffffff58;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_ffffffffffffff90;
  LinearModel<double> local_60 [2];
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_38;
  undefined5 in_stack_ffffffffffffffd0;
  
  bVar5 = in_stack_00000008 & 1;
  bVar4 = in_stack_00000010 & 1;
  bVar1 = in_stack_00000018 & 1;
  data_node_allocator(in_stack_ffffffffffffff48);
  pAVar3 = __gnu_cxx::
           new_allocator<alex::AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>_>
           ::allocate((new_allocator<alex::AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>_>
                       *)in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,
                      (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  ::AlexDataNode(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (allocator<std::pair<double,_double>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::
  allocator<alex::AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>_>
  ::~allocator((allocator<alex::AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>_>
                *)0x120845);
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_38 = pAVar3;
  if (in_R9 == (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                *)0x0) {
    if ((bVar5 & 1) == 0) {
      AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
      ::bulk_load_from_existing
                (in_stack_00000070,in_stack_00000068,precomputed_model.b_._4_4_,
                 precomputed_model.b_._0_4_,precomputed_model.a_._7_1_,precomputed_model.a_._6_1_,
                 (LinearModel<double> *)node,in_stack_00000088);
    }
    else {
      iVar2 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              ::num_keys_in_range(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                                  in_stack_ffffffffffffff88);
      LinearModel<double>::LinearModel
                ((LinearModel<double> *)&stack0xffffffffffffff88,
                 &(in_RSI->super_AlexNode<double,_double>).model_);
      LinearModel<double>::expand
                ((LinearModel<double> *)&stack0xffffffffffffff88,
                 (double)iVar2 / (double)(in_ECX - in_EDX));
      AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
      ::bulk_load_from_existing
                (in_stack_00000070,in_stack_00000068,precomputed_model.b_._4_4_,
                 precomputed_model.b_._0_4_,precomputed_model.a_._7_1_,precomputed_model.a_._6_1_,
                 (LinearModel<double> *)node,in_stack_00000088);
    }
  }
  else {
    LinearModel<double>::LinearModel(local_60,(double)in_R9->allocator_,(double)in_R9->next_leaf_);
    AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
    ::bulk_load_from_existing
              (in_stack_00000070,in_stack_00000068,precomputed_model.b_._4_4_,
               precomputed_model.b_._0_4_,precomputed_model.a_._7_1_,precomputed_model.a_._6_1_,
               (LinearModel<double> *)node,in_stack_00000088);
  }
  local_38->max_slots_ = *(int *)(in_RDI + 0x24);
  if ((in_R8B & 1) != 0) {
    AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
    ::frac_inserts(in_RSI);
    dVar6 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
            ::compute_expected_cost
                      (in_R9,(double)CONCAT17(bVar5,CONCAT16(bVar4,CONCAT15(bVar1,
                                                  in_stack_ffffffffffffffd0))));
    (local_38->super_AlexNode<double,_double>).cost_ = dVar6;
  }
  return local_38;
}

Assistant:

data_node_type* bulk_load_leaf_node_from_existing(
      const data_node_type* existing_node, int left, int right,
      bool compute_cost = true, const fanout_tree::FTNode* tree_node = nullptr,
      bool reuse_model = false, bool keep_left = false,
      bool keep_right = false) {
    auto node = new (data_node_allocator().allocate(1))
        data_node_type(key_less_, allocator_);
    stats_.num_data_nodes++;
    if (tree_node) {
      // Use the model and num_keys saved in the tree node so we don't have to
      // recompute it
      LinearModel<T> precomputed_model(tree_node->a, tree_node->b);
      node->bulk_load_from_existing(existing_node, left, right, keep_left,
                                    keep_right, &precomputed_model,
                                    tree_node->num_keys);
    } else if (reuse_model) {
      // Use the model from the existing node
      // Assumes the model is accurate
      int num_actual_keys = existing_node->num_keys_in_range(left, right);
      LinearModel<T> precomputed_model(existing_node->model_);
      precomputed_model.b_ -= left;
      precomputed_model.expand(static_cast<double>(num_actual_keys) /
                               (right - left));
      node->bulk_load_from_existing(existing_node, left, right, keep_left,
                                    keep_right, &precomputed_model,
                                    num_actual_keys);
    } else {
      node->bulk_load_from_existing(existing_node, left, right, keep_left,
                                    keep_right);
    }
    node->max_slots_ = derived_params_.max_data_node_slots;
    if (compute_cost) {
      node->cost_ = node->compute_expected_cost(existing_node->frac_inserts());
    }
    return node;
  }